

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall
Fl_Text_Buffer::outputfile(Fl_Text_Buffer *this,char *file,int start,int end,int buflen)

{
  int iVar1;
  FILE *__s;
  char *__ptr;
  size_t sVar2;
  
  __s = (FILE *)fl_fopen(file,"w");
  if (__s == (FILE *)0x0) {
    iVar1 = 1;
  }
  else {
    do {
      iVar1 = end - start;
      if (buflen <= end - start) {
        iVar1 = buflen;
      }
      if (iVar1 == 0) break;
      __ptr = text_range(this,start,iVar1 + start);
      sVar2 = fwrite(__ptr,1,(long)iVar1,__s);
      free(__ptr);
      start = iVar1 + start;
    } while (iVar1 == (int)sVar2);
    iVar1 = ferror(__s);
    iVar1 = (uint)(iVar1 != 0) * 2;
    fclose(__s);
  }
  return iVar1;
}

Assistant:

int Fl_Text_Buffer::outputfile(const char *file,
			       int start, int end,
			       int buflen) {
  FILE *fp;
  if (!(fp = fl_fopen(file, "w")))
    return 1;
  for (int n; (n = min(end - start, buflen)); start += n) {
    const char *p = text_range(start, start + n);
    int r = (int) fwrite(p, 1, n, fp);
    free((void *) p);
    if (r != n)
      break;
  }
  
  int e = ferror(fp) ? 2 : 0;
  fclose(fp);
  return e;
}